

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountAggregate.cpp
# Opt level: O3

void __thiscall CountAggregate::createAggregateRegister(CountAggregate *this)

{
  DTree *this_00;
  int *piVar1;
  int **ppiVar2;
  bool *pbVar3;
  DTreeNode *pDVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong __n;
  ulong uVar8;
  
  std::
  vector<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
  ::resize(&this->_aggregateRegister,dfdb::params::NUM_OF_ATTRIBUTES);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::resize(&this->_lineageRegister,dfdb::params::NUM_OF_ATTRIBUTES);
  uVar8 = dfdb::params::NUM_OF_ATTRIBUTES;
  uVar7 = -(ulong)((dfdb::params::NUM_OF_ATTRIBUTES & 0x3000000000000000) != 0) |
          dfdb::params::NUM_OF_ATTRIBUTES << 4;
  piVar1 = (int *)operator_new__(uVar7);
  memset(piVar1,0,uVar7);
  this->_numberOfAggregatesPerNode = piVar1;
  uVar7 = -(ulong)(uVar8 >> 0x3e != 0) | uVar8 * 4;
  piVar1 = (int *)operator_new__(uVar7);
  memset(piVar1,0,uVar7);
  this->_degreeOfLocalAggregates = piVar1;
  uVar7 = -(ulong)(uVar8 >> 0x3d != 0) | uVar8 * 8;
  ppiVar2 = (int **)operator_new__(uVar7);
  this->aggPlaceholder = ppiVar2;
  ppiVar2 = (int **)operator_new__(uVar7);
  this->lineagePlaceholder = ppiVar2;
  pbVar3 = (bool *)operator_new__(uVar8);
  memset(pbVar3,0,uVar8);
  this->onehotfeatures = pbVar3;
  pbVar3 = (bool *)operator_new__(uVar8);
  memset(pbVar3,0,uVar8);
  this->isDetermined = pbVar3;
  uVar7 = -(ulong)(uVar8 + 1 >> 0x3e != 0) | uVar8 * 4 + 4;
  piVar1 = (int *)operator_new__(uVar7);
  memset(piVar1,0,uVar7);
  this->determinedBy = piVar1;
  uVar7 = -(ulong)(dfdb::params::NUM_OF_FEATURES >> 0x3d != 0) | dfdb::params::NUM_OF_FEATURES << 3;
  ppiVar2 = (int **)operator_new__(uVar7);
  memset(ppiVar2,0,uVar7);
  this->_features = ppiVar2;
  if (uVar8 != 0) {
    uVar7 = 0;
    do {
      this_00 = (this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (uVar7 != (long)this_00->_root->_id) {
        pDVar4 = DTree::getNode(this_00,(int)uVar7);
        lVar5 = (long)pDVar4->_parent->_numOfChildren;
        uVar8 = lVar5 * 4 + 8;
        if (lVar5 < -2) {
          uVar8 = 0xffffffffffffffff;
        }
        piVar1 = (int *)operator_new__(uVar8);
        memset(piVar1,0,uVar8);
        this->aggPlaceholder[uVar7] = piVar1;
        uVar8 = dfdb::params::NUM_OF_ATTRIBUTES;
        __n = dfdb::params::NUM_OF_ATTRIBUTES * 4 + 4;
        if (0x3fffffffffffffff < dfdb::params::NUM_OF_ATTRIBUTES + 1) {
          __n = 0xffffffffffffffff;
        }
        piVar1 = (int *)operator_new__(__n);
        memset(piVar1,0,__n);
        this->lineagePlaceholder[uVar7] = piVar1;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar8);
  }
  registerAggregatesFromModel
            (this,((this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _root);
  uVar8 = dfdb::params::NUM_OF_ATTRIBUTES;
  piVar1 = this->_numberOfAggregatesPerNode;
  piVar1[dfdb::params::NUM_OF_ATTRIBUTES] = 0;
  if (uVar8 == 1) {
    piVar1[3] = 0;
  }
  else {
    iVar6 = piVar1[uVar8];
    lVar5 = 0;
    do {
      iVar6 = iVar6 + piVar1[lVar5];
      (piVar1 + uVar8)[lVar5 + 1] = iVar6;
      lVar5 = lVar5 + 1;
    } while (uVar8 - 1 != lVar5);
    piVar1[uVar8 * 3] = 0;
    iVar6 = 0;
    lVar5 = 0;
    do {
      iVar6 = iVar6 + piVar1[uVar8 * 2 + lVar5];
      (piVar1 + uVar8 * 3)[lVar5 + 1] = iVar6;
      lVar5 = lVar5 + 1;
    } while (uVar8 - 1 != lVar5);
  }
  return;
}

Assistant:

void CountAggregate::createAggregateRegister()
{
    _aggregateRegister.resize(NUM_OF_ATTRIBUTES);
    _lineageRegister.resize(NUM_OF_ATTRIBUTES);
    
    _numberOfAggregatesPerNode = new int[NUM_OF_ATTRIBUTES * 4]();
    _degreeOfLocalAggregates = new int[NUM_OF_ATTRIBUTES]();

    aggPlaceholder = new int*[NUM_OF_ATTRIBUTES];
    lineagePlaceholder = new int*[NUM_OF_ATTRIBUTES];

    onehotfeatures = new bool[NUM_OF_ATTRIBUTES]();
    isDetermined = new bool[NUM_OF_ATTRIBUTES]();
    determinedBy = new int[NUM_OF_ATTRIBUTES + 1]();

    /* Read in features from file and finds the labels. */
    _features = new int*[NUM_OF_FEATURES]();

    
    for (size_t i = 0; i < NUM_OF_ATTRIBUTES; ++i)
    {        
        if (i != (size_t) _dTree->_root->_id)
        {
            int numOfChildren = _dTree->getNode(i)->_parent->_numOfChildren;
            aggPlaceholder[i] = new int[numOfChildren + 2]();
            lineagePlaceholder[i] = new int[NUM_OF_ATTRIBUTES + 1]();
        }
    }

    /* Registers aggregates to the d-tree nodes following the structure of the model. */
    registerAggregatesFromModel(_dTree->_root);

    /* Setting the upper half of _numberOfAggregatesPerNode, which provides offsets */
    _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES] = 0;
    for (size_t attID = 0; attID < NUM_OF_ATTRIBUTES - 1; ++attID)
        _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES + attID + 1] =
            _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES + attID]
            + _numberOfAggregatesPerNode[attID];

    _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3] = 0;
    for (size_t attID = 0; attID < NUM_OF_ATTRIBUTES - 1; ++attID)
        _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3 + attID + 1] =
            _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3 + attID]
            + _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + attID];
}